

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplewidgets.cpp
# Opt level: O0

State __thiscall QAccessibleGroupBox::state(QAccessibleGroupBox *this)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  State SVar4;
  QAccessibleWidget *in_RDI;
  long in_FS_OFFSET;
  State st;
  QGroupBox *in_stack_ffffffffffffffe0;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar4 = QAccessibleWidget::state(in_RDI);
  local_10 = (State)CONCAT35(0xaaaaaa,SVar4._0_5_);
  groupBox((QAccessibleGroupBox *)0x7efb0f);
  bVar2 = QGroupBox::isCheckable(in_stack_ffffffffffffffe0);
  groupBox((QAccessibleGroupBox *)0x7efb33);
  bVar3 = QGroupBox::isChecked(in_stack_ffffffffffffffe0);
  local_10._0_4_ = SVar4._0_4_ & 0xffffff9f | (uint)bVar2 << 5 | (uint)bVar3 << 6;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

QAccessible::State QAccessibleGroupBox::state() const
{
    QAccessible::State st = QAccessibleWidget::state();
    st.checkable = groupBox()->isCheckable();
    st.checked = groupBox()->isChecked();
    return st;
}